

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O0

void __thiscall
LASquadtree::intersect_tile_with_cells
          (LASquadtree *this,F32 ll_x,F32 ll_y,F32 ur_x,F32 ur_y,F32 cell_min_x,F32 cell_max_x,
          F32 cell_min_y,F32 cell_max_y,U32 level,U32 level_index)

{
  U32 local_44;
  float local_40;
  float local_3c;
  float cell_mid_y;
  float cell_mid_x;
  U32 level_index_local;
  U32 level_local;
  F32 cell_max_y_local;
  F32 cell_min_y_local;
  F32 cell_max_x_local;
  F32 cell_min_x_local;
  F32 ur_y_local;
  F32 ur_x_local;
  F32 ll_y_local;
  F32 ll_x_local;
  LASquadtree *this_local;
  
  level_index_local = (U32)cell_max_y;
  level_local = (U32)cell_min_y;
  cell_max_y_local = cell_max_x;
  cell_min_y_local = cell_min_x;
  cell_max_x_local = ur_y;
  cell_min_x_local = ur_x;
  ur_y_local = ll_y;
  ur_x_local = ll_x;
  _ll_y_local = this;
  if (level == 0) {
    local_44 = level_index;
    cell_mid_y = (float)level_index;
    cell_mid_x = (float)level;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)this->current_cells,
               (value_type_conflict *)&local_44);
  }
  else {
    cell_mid_x = (float)(level - 1);
    cell_mid_y = (float)(level_index << 2);
    local_3c = ((float)cell_min_x + (float)cell_max_x) / 2.0;
    local_40 = ((float)cell_min_y + (float)cell_max_y) / 2.0;
    if (local_3c < (float)ur_x) {
      if ((float)ll_x < local_3c) {
        if (local_40 < (float)ur_y) {
          if ((float)ll_y < local_40) {
            intersect_tile_with_cells
                      (this,ll_x,ll_y,ur_x,ur_y,cell_min_x,(F32)local_3c,cell_min_y,(F32)local_40,
                       (U32)cell_mid_x,(U32)cell_mid_y);
            intersect_tile_with_cells
                      (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,(F32)local_3c,
                       cell_max_y_local,(F32)level_local,(F32)local_40,(U32)cell_mid_x,
                       (uint)cell_mid_y | 1);
            intersect_tile_with_cells
                      (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,cell_min_y_local
                       ,(F32)local_3c,(F32)local_40,(F32)level_index_local,(U32)cell_mid_x,
                       (uint)cell_mid_y | 2);
            intersect_tile_with_cells
                      (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,(F32)local_3c,
                       cell_max_y_local,(F32)local_40,(F32)level_index_local,(U32)cell_mid_x,
                       (uint)cell_mid_y | 3);
          }
          else {
            intersect_tile_with_cells
                      (this,ll_x,ll_y,ur_x,ur_y,cell_min_x,(F32)local_3c,(F32)local_40,cell_max_y,
                       (U32)cell_mid_x,(uint)cell_mid_y | 2);
            intersect_tile_with_cells
                      (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,(F32)local_3c,
                       cell_max_y_local,(F32)local_40,(F32)level_index_local,(U32)cell_mid_x,
                       (uint)cell_mid_y | 3);
          }
        }
        else {
          intersect_tile_with_cells
                    (this,ll_x,ll_y,ur_x,ur_y,cell_min_x,(F32)local_3c,cell_min_y,(F32)local_40,
                     (U32)cell_mid_x,(U32)cell_mid_y);
          intersect_tile_with_cells
                    (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,(F32)local_3c,
                     cell_max_y_local,(F32)level_local,(F32)local_40,(U32)cell_mid_x,
                     (uint)cell_mid_y | 1);
        }
      }
      else if (local_40 < (float)ur_y) {
        if ((float)ll_y < local_40) {
          intersect_tile_with_cells
                    (this,ll_x,ll_y,ur_x,ur_y,(F32)local_3c,cell_max_x,cell_min_y,(F32)local_40,
                     (U32)cell_mid_x,(uint)cell_mid_y | 1);
          intersect_tile_with_cells
                    (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,(F32)local_3c,
                     cell_max_y_local,(F32)local_40,(F32)level_index_local,(U32)cell_mid_x,
                     (uint)cell_mid_y | 3);
        }
        else {
          intersect_tile_with_cells
                    (this,ll_x,ll_y,ur_x,ur_y,(F32)local_3c,cell_max_x,(F32)local_40,cell_max_y,
                     (U32)cell_mid_x,(uint)cell_mid_y | 3);
        }
      }
      else {
        intersect_tile_with_cells
                  (this,ll_x,ll_y,ur_x,ur_y,(F32)local_3c,cell_max_x,cell_min_y,(F32)local_40,
                   (U32)cell_mid_x,(uint)cell_mid_y | 1);
      }
    }
    else if (local_40 < (float)ur_y) {
      if ((float)ll_y < local_40) {
        intersect_tile_with_cells
                  (this,ll_x,ll_y,ur_x,ur_y,cell_min_x,(F32)local_3c,cell_min_y,(F32)local_40,
                   (U32)cell_mid_x,(U32)cell_mid_y);
        intersect_tile_with_cells
                  (this,ur_x_local,ur_y_local,cell_min_x_local,cell_max_x_local,cell_min_y_local,
                   (F32)local_3c,(F32)local_40,(F32)level_index_local,(U32)cell_mid_x,
                   (uint)cell_mid_y | 2);
      }
      else {
        intersect_tile_with_cells
                  (this,ll_x,ll_y,ur_x,ur_y,cell_min_x,(F32)local_3c,(F32)local_40,cell_max_y,
                   (U32)cell_mid_x,(uint)cell_mid_y | 2);
      }
    }
    else {
      intersect_tile_with_cells
                (this,ll_x,ll_y,ur_x,ur_y,cell_min_x,(F32)local_3c,cell_min_y,(F32)local_40,
                 (U32)cell_mid_x,(U32)cell_mid_y);
    }
  }
  return;
}

Assistant:

void LASquadtree::intersect_tile_with_cells(const F32 ll_x, const F32 ll_y, const F32 ur_x, const F32 ur_y, const F32 cell_min_x, const F32 cell_max_x, const F32 cell_min_y, const F32 cell_max_y, U32 level, U32 level_index)
{
  volatile float cell_mid_x;
  volatile float cell_mid_y;
  if (level)
  {
    level--;
    level_index <<= 2;

    cell_mid_x = (cell_min_x + cell_max_x)/2;
    cell_mid_y = (cell_min_y + cell_max_y)/2;

    if (ur_x <= cell_mid_x)
    {
      // cell_max_x = cell_mid_x;
      if (ur_y <= cell_mid_y)
      {
        // cell_max_y = cell_mid_y;
        intersect_tile_with_cells(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
      }
      else if (!(ll_y < cell_mid_y))
      {
        // cell_min_y = cell_mid_y;
        // level_index |= 1;
        intersect_tile_with_cells(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
      }
      else
      {
        intersect_tile_with_cells(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
        intersect_tile_with_cells(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
      }
    }
    else if (!(ll_x < cell_mid_x))
    {
      // cell_min_x = cell_mid_x;
      // level_index |= 1;
      if (ur_y <= cell_mid_y)
      {
        // cell_max_y = cell_mid_y;
        intersect_tile_with_cells(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
      }
      else if (!(ll_y < cell_mid_y))
      {
        // cell_min_y = cell_mid_y;
        // level_index |= 1;
        intersect_tile_with_cells(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
      else
      {
        intersect_tile_with_cells(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
        intersect_tile_with_cells(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
    }
    else
    {
      if (ur_y <= cell_mid_y)
      {
        // cell_max_y = cell_mid_y;
        intersect_tile_with_cells(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
        intersect_tile_with_cells(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
      }
      else if (!(ll_y < cell_mid_y))
      {
        // cell_min_y = cell_mid_y;
        // level_index |= 1;
        intersect_tile_with_cells(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
        intersect_tile_with_cells(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
      else
      {
        intersect_tile_with_cells(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
        intersect_tile_with_cells(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
        intersect_tile_with_cells(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
        intersect_tile_with_cells(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
    }
  }
  else
  {
    ((my_cell_vector*)current_cells)->push_back(level_index);
  }
}